

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.h
# Opt level: O2

string * __thiscall
ctemplate::TemplateDictionary::name_abi_cxx11_
          (string *__return_storage_ptr__,TemplateDictionary *this)

{
  long lVar1;
  long lVar2;
  
  lVar1 = *(long *)(this + 0x18);
  lVar2 = *(long *)(this + 0x20);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,lVar1,lVar2 + lVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string name() const {
    return std::string(name_.data(), name_.size());
  }